

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::SSLClient::verify_host_with_subject_alt_name(SSLClient *this,X509 *server_cert)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  GENERAL_NAMES *a;
  int *piVar6;
  char *pattern;
  ulong uVar7;
  int iVar8;
  in_addr addr;
  in6_addr addr6;
  undefined1 local_54 [4];
  SSLClient *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  iVar3 = inet_pton(10,(this->super_ClientImpl).host_._M_dataplus._M_p,local_40);
  if (iVar3 == 0) {
    iVar3 = inet_pton(2,(this->super_ClientImpl).host_._M_dataplus._M_p,local_54);
    uVar7 = (ulong)((uint)(iVar3 != 0) * 4);
    iVar3 = (uint)(iVar3 != 0) * 5 + 2;
  }
  else {
    iVar3 = 7;
    uVar7 = 0x10;
  }
  bVar1 = false;
  a = (GENERAL_NAMES *)X509_get_ext_d2i((X509 *)server_cert,0x55,(int *)0x0,(int *)0x0);
  if (a != (GENERAL_NAMES *)0x0) {
    local_48 = uVar7;
    iVar4 = OPENSSL_sk_num(a);
    if (iVar4 < 1) {
      bVar1 = false;
    }
    else {
      iVar8 = 1;
      bVar2 = 0;
      local_50 = this;
      do {
        piVar6 = (int *)OPENSSL_sk_value(a,iVar8 + -1);
        if (*piVar6 == iVar3) {
          pattern = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar6 + 2));
          iVar5 = ASN1_STRING_length(*(ASN1_STRING **)(piVar6 + 2));
          uVar7 = local_48;
          if (iVar3 == 7) {
            iVar5 = bcmp(local_40,pattern,local_48);
            if (iVar5 != 0) {
              iVar5 = bcmp(local_54,pattern,uVar7);
              if (iVar5 != 0) goto LAB_001333ed;
            }
            bVar2 = 1;
            goto LAB_001333ed;
          }
          if (iVar3 != 2) goto LAB_001333ed;
          bVar1 = check_host_name(local_50,pattern,(long)iVar5);
        }
        else {
LAB_001333ed:
          bVar1 = false;
        }
      } while ((iVar8 < iVar4) && (iVar8 = iVar8 + 1, bVar1 == false));
      bVar1 = (bool)(bVar1 | bVar2);
    }
  }
  GENERAL_NAMES_free(a);
  return bVar1;
}

Assistant:

inline bool
        SSLClient::verify_host_with_subject_alt_name(X509 * server_cert) const {
        auto ret = false;

        auto type = GEN_DNS;

        struct in6_addr addr6;
        struct in_addr addr;
        size_t addr_len = 0;

    #ifndef __MINGW32__
        if (inet_pton(AF_INET6, host_.c_str(), &addr6)) {
            type = GEN_IPADD;
            addr_len = sizeof(struct in6_addr);
        } else if (inet_pton(AF_INET, host_.c_str(), &addr)) {
            type = GEN_IPADD;
            addr_len = sizeof(struct in_addr);
        }
    #endif

        auto alt_names = static_cast<const struct stack_st_GENERAL_NAME*>(
            X509_get_ext_d2i(server_cert, NID_subject_alt_name, nullptr, nullptr));

        if (alt_names) {
            auto dsn_matched = false;
            auto ip_mached = false;

            auto count = sk_GENERAL_NAME_num(alt_names);

            for (decltype(count) i = 0; i < count && !dsn_matched; i++) {
                auto val = sk_GENERAL_NAME_value(alt_names, i);
                if (val->type == type) {
                    auto name = (const char*)ASN1_STRING_get0_data(val->d.ia5);
                    auto name_len = (size_t)ASN1_STRING_length(val->d.ia5);

                    switch (type) {
                        case GEN_DNS: dsn_matched = check_host_name(name, name_len); break;

                        case GEN_IPADD:
                            if (!memcmp(&addr6, name, addr_len) ||
                                !memcmp(&addr, name, addr_len)) {
                                ip_mached = true;
                            }
                            break;
                    }
                }
            }

            if (dsn_matched || ip_mached) { ret = true; }
        }

        GENERAL_NAMES_free((STACK_OF(GENERAL_NAME)*)alt_names);
        return ret;
    }